

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

Status cmsys::SystemTools::MakeDirectory(char *path,mode_t *mode)

{
  Status SVar1;
  allocator<char> local_31;
  string local_30;
  
  if (path == (char *)0x0) {
    SVar1.Kind_ = POSIX;
    SVar1.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x16;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,path,&local_31);
    SVar1 = MakeDirectory(&local_30,mode);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return SVar1;
}

Assistant:

Status SystemTools::MakeDirectory(const char* path, const mode_t* mode)
{
  if (!path) {
    return Status::POSIX(EINVAL);
  }
  return SystemTools::MakeDirectory(std::string(path), mode);
}